

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte unaff_BPL;
  byte *pbVar11;
  byte *pbVar12;
  int iVar13;
  uint32 uVar14;
  string message_data;
  CodedInputStream sub_input;
  byte *local_a0;
  long local_98;
  byte local_90 [16];
  CodedInputStream local_80;
  
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  iVar13 = 0;
  do {
    pbVar11 = input->buffer_;
    uVar6 = 0;
    if ((pbVar11 < input->buffer_end_) && (uVar6 = (uint)*pbVar11, -1 < (char)*pbVar11)) {
      input->buffer_ = pbVar11 + 1;
    }
    else {
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
    }
    if ((int)uVar6 < 0x10) {
      if (uVar6 == 0) {
LAB_002c0ad1:
        bVar1 = false;
        unaff_BPL = 0;
      }
      else {
        if (uVar6 != 0xc) {
LAB_002c0abb:
          iVar7 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar6);
          cVar3 = (char)iVar7;
LAB_002c0ac9:
          if (cVar3 == '\0') goto LAB_002c0ad1;
          goto LAB_002c0cd6;
        }
        unaff_BPL = 1;
        bVar1 = false;
      }
    }
    else {
      if (uVar6 != 0x10) {
        if (uVar6 != 0x1a) goto LAB_002c0abb;
        if (iVar13 != 0) {
          cVar3 = ParseField(this,iVar13 * 8 + 2,input,extension_finder,field_skipper);
          goto LAB_002c0ac9;
        }
        pbVar11 = input->buffer_;
        if (pbVar11 < input->buffer_end_) {
          bVar4 = *pbVar11;
          uVar10 = (ulong)bVar4;
          uVar14 = (uint32)bVar4;
          if ((char)bVar4 < '\0') goto LAB_002c0c1c;
          input->buffer_ = pbVar11 + 1;
          bVar4 = 0;
        }
        else {
          uVar14 = 0;
LAB_002c0c1c:
          uVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
          bVar4 = (byte)(uVar10 >> 0x3f);
        }
        uVar6 = (uint)uVar10;
        iVar13 = 0;
        bVar5 = false;
        bVar2 = 0;
        if (-1 < (int)uVar6 && bVar4 == 0) {
          iVar7 = 0x1f;
          if ((uVar6 | 1) != 0) {
            for (; (uVar6 | 1) >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          bVar4 = (byte)uVar10;
          std::__cxx11::string::resize((ulong)&local_a0,(char)(iVar7 * 9 + 0x49U >> 6) + bVar4);
          if (uVar6 < 0x80) {
            *local_a0 = bVar4;
            pbVar11 = local_a0 + 1;
          }
          else {
            *local_a0 = bVar4 | 0x80;
            uVar10 = uVar10 >> 7 & 0x1ffffff;
            if (uVar6 < 0x4000) {
              local_a0[1] = (byte)uVar10;
              pbVar11 = local_a0 + 2;
            }
            else {
              pbVar11 = local_a0 + 2;
              do {
                pbVar12 = pbVar11;
                uVar8 = (uint)uVar10;
                pbVar12[-1] = (byte)uVar10 | 0x80;
                uVar9 = uVar8 >> 7;
                uVar10 = (ulong)uVar9;
                pbVar11 = pbVar12 + 1;
              } while (0x3fff < uVar8);
              *pbVar12 = (byte)uVar9;
            }
          }
          bVar5 = io::CodedInputStream::ReadRaw(input,pbVar11,uVar6);
          bVar2 = unaff_BPL & bVar5;
        }
        unaff_BPL = bVar2;
        bVar1 = false;
        if (bVar5 != false) goto LAB_002c0cd6;
        goto LAB_002c0cd8;
      }
      pbVar11 = input->buffer_;
      if (pbVar11 < input->buffer_end_) {
        bVar4 = *pbVar11;
        uVar10 = (ulong)bVar4;
        uVar14 = (uint32)bVar4;
        if ((char)bVar4 < '\0') goto LAB_002c0b20;
        input->buffer_ = pbVar11 + 1;
        bVar5 = true;
      }
      else {
        uVar14 = 0;
LAB_002c0b20:
        uVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar14);
        bVar5 = -1 < (long)uVar10;
      }
      iVar7 = (int)uVar10;
      if (bVar5) {
        iVar13 = iVar7;
        if (local_98 == 0) {
          bVar5 = true;
        }
        else {
          local_80.buffer_ = local_a0;
          local_80.total_bytes_read_ = (int)local_98;
          local_80.buffer_end_ = local_a0 + local_80.total_bytes_read_;
          local_80.input_ = (ZeroCopyInputStream *)0x0;
          local_80.overflow_bytes_ = 0;
          local_80.last_tag_ = 0;
          local_80.legitimate_message_end_ = false;
          local_80.aliasing_enabled_ = false;
          local_80.buffer_size_after_limit_ = 0;
          local_80.total_bytes_limit_ = 0x7fffffff;
          local_80.extension_pool_ = (DescriptorPool *)0x0;
          local_80.extension_factory_ = (MessageFactory *)0x0;
          local_80.recursion_budget_ = input->recursion_budget_;
          local_80.current_limit_ = local_80.total_bytes_read_;
          local_80.recursion_limit_ = local_80.recursion_budget_;
          bVar5 = ParseField(this,iVar7 * 8 + 2,&local_80,extension_finder,field_skipper);
          if (bVar5) {
            local_98 = 0;
            *local_a0 = 0;
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream(&local_80);
        }
      }
      else {
        bVar5 = false;
        unaff_BPL = 0;
      }
      if (bVar5 == false) {
        bVar1 = false;
      }
      else {
LAB_002c0cd6:
        bVar1 = true;
      }
    }
LAB_002c0cd8:
    if (!bVar1) {
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}